

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O3

void __thiscall
CInfoMessages::RenderFinishMsg(CInfoMessages *this,CInfoMsg *pInfoMsg,float x,float y)

{
  ITextRender *pIVar1;
  IGraphics *pIVar2;
  CGameClient *pCVar3;
  vec2 CursorPosition;
  vec2 Pos;
  CAnimState *pAnim;
  int Emote;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar6;
  float fVar7;
  vec4 local_68;
  vec4 local_58;
  float local_40;
  float local_3c;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  fVar7 = (pInfoMsg->m_Player1NameCursor).m_Width;
  fVar4 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,36.0);
  if (pInfoMsg->m_Diff != 0) {
    fVar5 = x - (pInfoMsg->m_DiffCursor).m_Width;
    (pInfoMsg->m_DiffCursor).m_CursorPos.field_0.x = fVar5;
    (pInfoMsg->m_DiffCursor).m_CursorPos.field_1.y = y;
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
              (0x3f800000,pIVar1,&pInfoMsg->m_DiffCursor,0,0xffffffff);
    x = fVar5 + -16.0;
  }
  fVar5 = x - (pInfoMsg->m_TimeCursor).m_Width;
  (pInfoMsg->m_TimeCursor).m_CursorPos.field_0.x = fVar5;
  (pInfoMsg->m_TimeCursor).m_CursorPos.field_1.y = y;
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar1,&pInfoMsg->m_TimeCursor,0,0xffffffff);
  fVar5 = fVar5 + -62.0;
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])
            (pIVar2,(ulong)(uint)g_pData->m_aImages[0x19].m_Id.m_Id);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_38 = 0x4250000042500000;
  pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  local_40 = fVar5;
  local_3c = y;
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,&local_40,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  aVar6.x = (fVar5 + -10.0) - (fVar4 + fVar7);
  local_58.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_58.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_58.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_58.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
  local_68.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
  local_68.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
  local_68.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
  local_68.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  CursorPosition.field_1.y = y;
  CursorPosition.field_0.x = aVar6.x;
  fVar7 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                            (pInfoMsg->m_Player1NameCursor).m_FontSize,CursorPosition,
                            pInfoMsg->m_Player1ID,&local_58,&local_68);
  (pInfoMsg->m_Player1NameCursor).m_CursorPos.field_0.x = fVar7 + aVar6.x;
  (pInfoMsg->m_Player1NameCursor).m_CursorPos.field_1.y = y;
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar1,&pInfoMsg->m_Player1NameCursor,0,0xffffffff);
  Emote = 2;
  if (pInfoMsg->m_RecordPersonal == 0) {
    Emote = (uint)(pInfoMsg->m_RecordServer != 0) * 2;
  }
  pCVar3 = (this->super_CComponent).m_pClient;
  pAnim = CAnimState::GetIdle();
  Pos.field_1.y = y + 28.0;
  Pos.field_0.x = aVar6.x + -28.0;
  CRenderTools::RenderTee
            (&pCVar3->m_RenderTools,pAnim,&pInfoMsg->m_Player1RenderInfo,Emote,(vec2)0xbf800000,Pos)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CInfoMessages::RenderFinishMsg(CInfoMsg *pInfoMsg, float x, float y) const
{
	float FontSize = 36.0f;
	float PlayerNameW = pInfoMsg->m_Player1NameCursor.Width() + UI()->GetClientIDRectWidth(FontSize);
	
	// render diff
	if(pInfoMsg->m_Diff != 0)
	{
		float DiffW = pInfoMsg->m_DiffCursor.Width();

		x -= DiffW;

		pInfoMsg->m_DiffCursor.MoveTo(x, y);
		TextRender()->DrawTextOutlined(&pInfoMsg->m_DiffCursor);

		x -= 16.0f;
	}

	// render time
	float TimeW = pInfoMsg->m_TimeCursor.Width();
	x -= TimeW;
	pInfoMsg->m_TimeCursor.MoveTo(x, y);
	TextRender()->DrawTextOutlined(&pInfoMsg->m_TimeCursor);
	x -= 52.0f + 10.0f;

	// render flag
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_RACEFLAG].m_Id);
	Graphics()->QuadsBegin();
	IGraphics::CQuadItem QuadItem(x, y, 52, 52);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	x -= 10.0f;

	// render player name
	x -= PlayerNameW;

	float AdvanceID = UI()->DrawClientID(pInfoMsg->m_Player1NameCursor.m_FontSize, vec2(x, y), pInfoMsg->m_Player1ID);
	pInfoMsg->m_Player1NameCursor.MoveTo(x + AdvanceID, y);
	TextRender()->DrawTextOutlined(&pInfoMsg->m_Player1NameCursor);

	x -= 28.0f;

	// render player tee
	int Emote = (pInfoMsg->m_RecordPersonal || pInfoMsg->m_RecordServer) ? EMOTE_HAPPY : EMOTE_NORMAL;
	RenderTools()->RenderTee(CAnimState::GetIdle(), &pInfoMsg->m_Player1RenderInfo, Emote, vec2(-1,0), vec2(x, y+28));
}